

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

socklen_t quicly_get_socklen(sockaddr *sa)

{
  socklen_t sVar1;
  
  sVar1 = 0x10;
  if (sa->sa_family != 2) {
    if (sa->sa_family != 10) {
      __assert_fail("!\"unexpected socket type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x175e,"socklen_t quicly_get_socklen(struct sockaddr *)");
    }
    sVar1 = 0x1c;
  }
  return sVar1;
}

Assistant:

socklen_t quicly_get_socklen(struct sockaddr *sa)
{
    switch (sa->sa_family) {
    case AF_INET:
        return sizeof(struct sockaddr_in);
    case AF_INET6:
        return sizeof(struct sockaddr_in6);
    default:
        assert(!"unexpected socket type");
        return 0;
    }
}